

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateFunctionPointer
          (ExpressionContext *ctx,SynBase *source,ExprFunctionDefinition *definition,
          bool hideFunction)

{
  FunctionData *function;
  TypeFunction *type;
  int iVar1;
  undefined4 extraout_var;
  SynBase *source_00;
  SynBase *source_01;
  ExprBase *context;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  ArrayView<ExprBase_*> arr;
  ExprFunctionDefinition *local_68;
  SmallArray<ExprBase_*,_3U> expressions;
  
  if ((int)CONCAT71(in_register_00000009,hideFunction) != 0) {
    ExpressionContext::HideFunction(ctx,definition->function);
    definition->function->isHidden = true;
  }
  expressions.allocator = ctx->allocator;
  expressions.data = expressions.little;
  expressions.count = 0;
  expressions.max = 3;
  local_68 = definition;
  SmallArray<ExprBase_*,_3U>::push_back(&expressions,(ExprBase **)&local_68);
  if ((ExprFunctionDefinition *)definition->contextVariableDefinition !=
      (ExprFunctionDefinition *)0x0) {
    local_68 = (ExprFunctionDefinition *)definition->contextVariableDefinition;
    SmallArray<ExprBase_*,_3U>::push_back(&expressions,(ExprBase **)&local_68);
  }
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  source_00 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
  function = definition->function;
  type = function->type;
  source_01 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
  context = CreateFunctionContextAccess(ctx,source_01,definition->function);
  ExprFunctionAccess::ExprFunctionAccess
            ((ExprFunctionAccess *)CONCAT44(extraout_var,iVar1),source_00,&type->super_TypeBase,
             function,context);
  local_68 = (ExprFunctionDefinition *)CONCAT44(extraout_var,iVar1);
  SmallArray<ExprBase_*,_3U>::push_back(&expressions,(ExprBase **)&local_68);
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
  arr.count = expressions.count;
  arr.data = expressions.data;
  arr._12_4_ = 0;
  ExprSequence::ExprSequence
            ((ExprSequence *)CONCAT44(extraout_var_00,iVar1),ctx->allocator,source,
             &definition->function->type->super_TypeBase,arr);
  SmallArray<ExprBase_*,_3U>::~SmallArray(&expressions);
  return &((ExprSequence *)CONCAT44(extraout_var_00,iVar1))->super_ExprBase;
}

Assistant:

ExprBase* CreateFunctionPointer(ExpressionContext &ctx, SynBase *source, ExprFunctionDefinition *definition, bool hideFunction)
{
	if(hideFunction)
	{
		ctx.HideFunction(definition->function);

		definition->function->isHidden = true;
	}

	SmallArray<ExprBase*, 3> expressions(ctx.allocator);

	expressions.push_back(definition);

	if(definition->contextVariableDefinition)
		expressions.push_back(definition->contextVariableDefinition);

	expressions.push_back(new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(ctx.MakeInternal(source), definition->function->type, definition->function, CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), definition->function)));

	return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, definition->function->type, expressions);
}